

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O1

void cs::
     foreach_helper<phmap::flat_hash_map<cs_impl::any,cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>,std::pair<cs_impl::any,cs_impl::any>>
               (context_t *context,string *iterator,var *obj,
               deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *body)

{
  char cVar1;
  element_type *peVar2;
  char *pcVar3;
  statement_base *psVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  int iVar11;
  int iVar12;
  undefined1 auVar13 [11];
  undefined1 auVar14 [11];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [13];
  undefined1 auVar18 [13];
  undefined1 auVar19 [14];
  undefined1 auVar20 [14];
  bool bVar21;
  undefined *puVar22;
  context_t *pcVar23;
  char *pcVar24;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *pdVar25;
  flat_hash_map<cs_impl::any,_cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
  *pfVar26;
  uint uVar27;
  int iVar28;
  slot_type *psVar29;
  _Map_pointer pppsVar30;
  _Elt_pointer ppsVar31;
  _Elt_pointer ppsVar32;
  char *pcVar33;
  char in_XMM1_Ba;
  char in_XMM1_Bb;
  char in_XMM1_Bc;
  char in_XMM1_Bd;
  char in_XMM1_Be;
  char in_XMM1_Bf;
  char in_XMM1_Bg;
  char in_XMM1_Bh;
  char in_XMM1_Bi;
  char in_XMM1_Bj;
  char in_XMM1_Bk;
  char in_XMM1_Bl;
  char in_XMM1_Bm;
  char in_XMM1_Bn;
  char in_XMM1_Bo;
  byte in_XMM1_Bp;
  scope_guard scope;
  scope_guard local_d8;
  pair<cs_impl::any,_cs_impl::any> local_d0;
  context_t *local_c0;
  any local_b8;
  char *local_b0;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *local_a8;
  string *local_a0;
  _Elt_pointer local_98;
  
  local_a0 = iterator;
  pfVar26 = cs_impl::any::
            const_val<phmap::flat_hash_map<cs_impl::any,cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>>
                      (obj);
  if ((pfVar26->
      super_raw_hash_map<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
      ).
      super_raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
      .size_ != 0) {
    peVar2 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar2->break_block == true) {
      peVar2->break_block = false;
    }
    if (peVar2->continue_block == true) {
      peVar2->continue_block = false;
    }
    local_d8.context = context;
    domain_manager::add_domain(&(peVar2->super_runtime_type).storage);
    pfVar26 = cs_impl::any::
              const_val<phmap::flat_hash_map<cs_impl::any,cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>>
                        (obj);
    pcVar3 = (pfVar26->
             super_raw_hash_map<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
             ).
             super_raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
             .ctrl_;
    psVar29 = (pfVar26->
              super_raw_hash_map<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
              ).
              super_raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
              .slots_;
    cVar1 = *pcVar3;
    pcVar33 = pcVar3;
    while (cVar1 < -1) {
      iVar28 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                      CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
      iVar10 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                      CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
      iVar11 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                      CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
      iVar12 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                      CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
      in_XMM1_Ba = -(*pcVar33 < (char)iVar28);
      in_XMM1_Bb = -(pcVar33[1] < (char)((uint)iVar28 >> 8));
      in_XMM1_Bc = -(pcVar33[2] < (char)((uint)iVar28 >> 0x10));
      in_XMM1_Bd = -(pcVar33[3] < (char)((uint)iVar28 >> 0x18));
      in_XMM1_Be = -(pcVar33[4] < (char)iVar10);
      in_XMM1_Bf = -(pcVar33[5] < (char)((uint)iVar10 >> 8));
      in_XMM1_Bg = -(pcVar33[6] < (char)((uint)iVar10 >> 0x10));
      in_XMM1_Bh = -(pcVar33[7] < (char)((uint)iVar10 >> 0x18));
      in_XMM1_Bi = -(pcVar33[8] < (char)iVar11);
      in_XMM1_Bj = -(pcVar33[9] < (char)((uint)iVar11 >> 8));
      in_XMM1_Bk = -(pcVar33[10] < (char)((uint)iVar11 >> 0x10));
      in_XMM1_Bl = -(pcVar33[0xb] < (char)((uint)iVar11 >> 0x18));
      in_XMM1_Bm = -(pcVar33[0xc] < (char)iVar12);
      in_XMM1_Bn = -(pcVar33[0xd] < (char)((uint)iVar12 >> 8));
      in_XMM1_Bo = -(pcVar33[0xe] < (char)((uint)iVar12 >> 0x10));
      in_XMM1_Bp = -(pcVar33[0xf] < (char)((uint)iVar12 >> 0x18));
      auVar6[1] = in_XMM1_Bb;
      auVar6[0] = in_XMM1_Ba;
      auVar6[2] = in_XMM1_Bc;
      auVar6[3] = in_XMM1_Bd;
      auVar6[4] = in_XMM1_Be;
      auVar6[5] = in_XMM1_Bf;
      auVar6[6] = in_XMM1_Bg;
      auVar6[7] = in_XMM1_Bh;
      auVar6[8] = in_XMM1_Bi;
      auVar6[9] = in_XMM1_Bj;
      auVar6[10] = in_XMM1_Bk;
      auVar6[0xb] = in_XMM1_Bl;
      auVar6[0xc] = in_XMM1_Bm;
      auVar6[0xd] = in_XMM1_Bn;
      auVar6[0xe] = in_XMM1_Bo;
      auVar6[0xf] = in_XMM1_Bp;
      auVar7[1] = in_XMM1_Bb;
      auVar7[0] = in_XMM1_Ba;
      auVar7[2] = in_XMM1_Bc;
      auVar7[3] = in_XMM1_Bd;
      auVar7[4] = in_XMM1_Be;
      auVar7[5] = in_XMM1_Bf;
      auVar7[6] = in_XMM1_Bg;
      auVar7[7] = in_XMM1_Bh;
      auVar7[8] = in_XMM1_Bi;
      auVar7[9] = in_XMM1_Bj;
      auVar7[10] = in_XMM1_Bk;
      auVar7[0xb] = in_XMM1_Bl;
      auVar7[0xc] = in_XMM1_Bm;
      auVar7[0xd] = in_XMM1_Bn;
      auVar7[0xe] = in_XMM1_Bo;
      auVar7[0xf] = in_XMM1_Bp;
      auVar19[1] = in_XMM1_Bd;
      auVar19[0] = in_XMM1_Bc;
      auVar19[2] = in_XMM1_Be;
      auVar19[3] = in_XMM1_Bf;
      auVar19[4] = in_XMM1_Bg;
      auVar19[5] = in_XMM1_Bh;
      auVar19[6] = in_XMM1_Bi;
      auVar19[7] = in_XMM1_Bj;
      auVar19[8] = in_XMM1_Bk;
      auVar19[9] = in_XMM1_Bl;
      auVar19[10] = in_XMM1_Bm;
      auVar19[0xb] = in_XMM1_Bn;
      auVar19[0xc] = in_XMM1_Bo;
      auVar19[0xd] = in_XMM1_Bp;
      auVar17[1] = in_XMM1_Be;
      auVar17[0] = in_XMM1_Bd;
      auVar17[2] = in_XMM1_Bf;
      auVar17[3] = in_XMM1_Bg;
      auVar17[4] = in_XMM1_Bh;
      auVar17[5] = in_XMM1_Bi;
      auVar17[6] = in_XMM1_Bj;
      auVar17[7] = in_XMM1_Bk;
      auVar17[8] = in_XMM1_Bl;
      auVar17[9] = in_XMM1_Bm;
      auVar17[10] = in_XMM1_Bn;
      auVar17[0xb] = in_XMM1_Bo;
      auVar17[0xc] = in_XMM1_Bp;
      auVar15[1] = in_XMM1_Bf;
      auVar15[0] = in_XMM1_Be;
      auVar15[2] = in_XMM1_Bg;
      auVar15[3] = in_XMM1_Bh;
      auVar15[4] = in_XMM1_Bi;
      auVar15[5] = in_XMM1_Bj;
      auVar15[6] = in_XMM1_Bk;
      auVar15[7] = in_XMM1_Bl;
      auVar15[8] = in_XMM1_Bm;
      auVar15[9] = in_XMM1_Bn;
      auVar15[10] = in_XMM1_Bo;
      auVar15[0xb] = in_XMM1_Bp;
      auVar13[1] = in_XMM1_Bg;
      auVar13[0] = in_XMM1_Bf;
      auVar13[2] = in_XMM1_Bh;
      auVar13[3] = in_XMM1_Bi;
      auVar13[4] = in_XMM1_Bj;
      auVar13[5] = in_XMM1_Bk;
      auVar13[6] = in_XMM1_Bl;
      auVar13[7] = in_XMM1_Bm;
      auVar13[8] = in_XMM1_Bn;
      auVar13[9] = in_XMM1_Bo;
      auVar13[10] = in_XMM1_Bp;
      uVar27 = (ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB141(auVar19 >> 7,0) & 1) << 2 |
                        (ushort)(SUB131(auVar17 >> 7,0) & 1) << 3 |
                        (ushort)(SUB121(auVar15 >> 7,0) & 1) << 4 |
                        (ushort)(SUB111(auVar13 >> 7,0) & 1) << 5 |
                        (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                 CONCAT18(in_XMM1_Bo,
                                                          CONCAT17(in_XMM1_Bn,
                                                                   CONCAT16(in_XMM1_Bm,
                                                                            CONCAT15(in_XMM1_Bl,
                                                                                     CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                        (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                 CONCAT17(in_XMM1_Bo,
                                                          CONCAT16(in_XMM1_Bn,
                                                                   CONCAT15(in_XMM1_Bm,
                                                                            CONCAT14(in_XMM1_Bl,
                                                                                     CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                       7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
      uVar5 = 0;
      if (uVar27 != 0) {
        for (; (uVar27 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      psVar29 = (slot_type *)((long)psVar29 + (ulong)(uVar5 << 4));
      cVar1 = pcVar33[uVar5];
      pcVar33 = pcVar33 + uVar5;
    }
    pcVar23 = context;
    pcVar24 = pcVar3 + (pfVar26->
                       super_raw_hash_map<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
                       ).
                       super_raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
                       .capacity_;
    pdVar25 = body;
    if (pcVar33 !=
        pcVar3 + (pfVar26->
                 super_raw_hash_map<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
                 ).
                 super_raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
                 .capacity_) {
      do {
        local_a8 = pdVar25;
        local_b0 = pcVar24;
        local_c0 = pcVar23;
        local_d0.first.mDat = (psVar29->value).first.mDat;
        if (local_d0.first.mDat != (proxy *)0x0) {
          (local_d0.first.mDat)->refcount = (local_d0.first.mDat)->refcount + 1;
        }
        local_d0.second.mDat = (psVar29->value).second.mDat;
        if (local_d0.second.mDat != (proxy *)0x0) {
          (local_d0.second.mDat)->refcount = (local_d0.second.mDat)->refcount + 1;
        }
        puVar22 = current_process;
        if ((*current_process & 1) != 0) {
          LOCK();
          *current_process = 0;
          UNLOCK();
          event_type::touch((event_type *)(puVar22 + 0xd0),(void *)0x0);
        }
        peVar2 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->instance).
                 super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        cs_impl::any::any<std::pair<cs_impl::any,cs_impl::any>>(&local_b8,&local_d0);
        domain_manager::add_var_no_return<std::__cxx11::string_const&>
                  (&(peVar2->super_runtime_type).storage,local_a0,&local_b8);
        cs_impl::any::recycle(&local_b8);
        ppsVar32 = (local_a8->
                   super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>).
                   _M_impl.super__Deque_impl_data._M_start._M_cur;
        local_98 = (local_a8->
                   super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>).
                   _M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (ppsVar32 != local_98) {
          ppsVar31 = (local_a8->
                     super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>)
                     ._M_impl.super__Deque_impl_data._M_start._M_last;
          pppsVar30 = (local_a8->
                      super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>
                      )._M_impl.super__Deque_impl_data._M_start._M_node;
          do {
            puVar22 = current_process;
            psVar4 = *ppsVar32;
            if ((*current_process & 1) != 0) {
              LOCK();
              *current_process = 0;
              UNLOCK();
              event_type::touch((event_type *)(puVar22 + 0xd0),(void *)0x0);
            }
            (*psVar4->_vptr_statement_base[3])(psVar4);
            peVar2 = (((local_c0->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->instance).
                     super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            iVar28 = 1;
            if (peVar2->return_fcall == false) {
              if (peVar2->break_block == true) {
                peVar2->break_block = false;
                goto LAB_002bab19;
              }
              if (peVar2->continue_block == true) {
                peVar2->continue_block = false;
                iVar28 = 4;
                goto LAB_002bab19;
              }
              iVar28 = 0;
              bVar21 = true;
            }
            else {
LAB_002bab19:
              bVar21 = false;
            }
            if (!bVar21) goto LAB_002bab50;
            ppsVar32 = ppsVar32 + 1;
            if (ppsVar32 == ppsVar31) {
              ppsVar32 = pppsVar30[1];
              pppsVar30 = pppsVar30 + 1;
              ppsVar31 = ppsVar32 + 0x40;
            }
          } while (ppsVar32 != local_98);
        }
        iVar28 = 4;
LAB_002bab50:
        pcVar3 = local_b0;
        context = local_c0;
        if (iVar28 == 4) {
          iVar28 = 0;
          domain_manager::next_domain
                    (&((((((local_d8.context)->
                          super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                        ->instance).
                        super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      super_runtime_type).storage);
        }
        cs_impl::any::recycle(&local_d0.second);
        cs_impl::any::recycle(&local_d0.first);
        if (iVar28 != 0) break;
        psVar29 = psVar29 + 1;
        cVar1 = pcVar33[1];
        pcVar33 = pcVar33 + 1;
        while (cVar1 < -1) {
          iVar28 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba)))
                          == CONCAT13(in_XMM1_Bd,
                                      CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
          iVar10 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be)))
                          == CONCAT13(in_XMM1_Bh,
                                      CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
          iVar11 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi)))
                          == CONCAT13(in_XMM1_Bl,
                                      CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
          iVar12 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm)))
                          == CONCAT13(in_XMM1_Bp,
                                      CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
          in_XMM1_Ba = -(*pcVar33 < (char)iVar28);
          in_XMM1_Bb = -(pcVar33[1] < (char)((uint)iVar28 >> 8));
          in_XMM1_Bc = -(pcVar33[2] < (char)((uint)iVar28 >> 0x10));
          in_XMM1_Bd = -(pcVar33[3] < (char)((uint)iVar28 >> 0x18));
          in_XMM1_Be = -(pcVar33[4] < (char)iVar10);
          in_XMM1_Bf = -(pcVar33[5] < (char)((uint)iVar10 >> 8));
          in_XMM1_Bg = -(pcVar33[6] < (char)((uint)iVar10 >> 0x10));
          in_XMM1_Bh = -(pcVar33[7] < (char)((uint)iVar10 >> 0x18));
          in_XMM1_Bi = -(pcVar33[8] < (char)iVar11);
          in_XMM1_Bj = -(pcVar33[9] < (char)((uint)iVar11 >> 8));
          in_XMM1_Bk = -(pcVar33[10] < (char)((uint)iVar11 >> 0x10));
          in_XMM1_Bl = -(pcVar33[0xb] < (char)((uint)iVar11 >> 0x18));
          in_XMM1_Bm = -(pcVar33[0xc] < (char)iVar12);
          in_XMM1_Bn = -(pcVar33[0xd] < (char)((uint)iVar12 >> 8));
          in_XMM1_Bo = -(pcVar33[0xe] < (char)((uint)iVar12 >> 0x10));
          in_XMM1_Bp = -(pcVar33[0xf] < (char)((uint)iVar12 >> 0x18));
          auVar8[1] = in_XMM1_Bb;
          auVar8[0] = in_XMM1_Ba;
          auVar8[2] = in_XMM1_Bc;
          auVar8[3] = in_XMM1_Bd;
          auVar8[4] = in_XMM1_Be;
          auVar8[5] = in_XMM1_Bf;
          auVar8[6] = in_XMM1_Bg;
          auVar8[7] = in_XMM1_Bh;
          auVar8[8] = in_XMM1_Bi;
          auVar8[9] = in_XMM1_Bj;
          auVar8[10] = in_XMM1_Bk;
          auVar8[0xb] = in_XMM1_Bl;
          auVar8[0xc] = in_XMM1_Bm;
          auVar8[0xd] = in_XMM1_Bn;
          auVar8[0xe] = in_XMM1_Bo;
          auVar8[0xf] = in_XMM1_Bp;
          auVar9[1] = in_XMM1_Bb;
          auVar9[0] = in_XMM1_Ba;
          auVar9[2] = in_XMM1_Bc;
          auVar9[3] = in_XMM1_Bd;
          auVar9[4] = in_XMM1_Be;
          auVar9[5] = in_XMM1_Bf;
          auVar9[6] = in_XMM1_Bg;
          auVar9[7] = in_XMM1_Bh;
          auVar9[8] = in_XMM1_Bi;
          auVar9[9] = in_XMM1_Bj;
          auVar9[10] = in_XMM1_Bk;
          auVar9[0xb] = in_XMM1_Bl;
          auVar9[0xc] = in_XMM1_Bm;
          auVar9[0xd] = in_XMM1_Bn;
          auVar9[0xe] = in_XMM1_Bo;
          auVar9[0xf] = in_XMM1_Bp;
          auVar20[1] = in_XMM1_Bd;
          auVar20[0] = in_XMM1_Bc;
          auVar20[2] = in_XMM1_Be;
          auVar20[3] = in_XMM1_Bf;
          auVar20[4] = in_XMM1_Bg;
          auVar20[5] = in_XMM1_Bh;
          auVar20[6] = in_XMM1_Bi;
          auVar20[7] = in_XMM1_Bj;
          auVar20[8] = in_XMM1_Bk;
          auVar20[9] = in_XMM1_Bl;
          auVar20[10] = in_XMM1_Bm;
          auVar20[0xb] = in_XMM1_Bn;
          auVar20[0xc] = in_XMM1_Bo;
          auVar20[0xd] = in_XMM1_Bp;
          auVar18[1] = in_XMM1_Be;
          auVar18[0] = in_XMM1_Bd;
          auVar18[2] = in_XMM1_Bf;
          auVar18[3] = in_XMM1_Bg;
          auVar18[4] = in_XMM1_Bh;
          auVar18[5] = in_XMM1_Bi;
          auVar18[6] = in_XMM1_Bj;
          auVar18[7] = in_XMM1_Bk;
          auVar18[8] = in_XMM1_Bl;
          auVar18[9] = in_XMM1_Bm;
          auVar18[10] = in_XMM1_Bn;
          auVar18[0xb] = in_XMM1_Bo;
          auVar18[0xc] = in_XMM1_Bp;
          auVar16[1] = in_XMM1_Bf;
          auVar16[0] = in_XMM1_Be;
          auVar16[2] = in_XMM1_Bg;
          auVar16[3] = in_XMM1_Bh;
          auVar16[4] = in_XMM1_Bi;
          auVar16[5] = in_XMM1_Bj;
          auVar16[6] = in_XMM1_Bk;
          auVar16[7] = in_XMM1_Bl;
          auVar16[8] = in_XMM1_Bm;
          auVar16[9] = in_XMM1_Bn;
          auVar16[10] = in_XMM1_Bo;
          auVar16[0xb] = in_XMM1_Bp;
          auVar14[1] = in_XMM1_Bg;
          auVar14[0] = in_XMM1_Bf;
          auVar14[2] = in_XMM1_Bh;
          auVar14[3] = in_XMM1_Bi;
          auVar14[4] = in_XMM1_Bj;
          auVar14[5] = in_XMM1_Bk;
          auVar14[6] = in_XMM1_Bl;
          auVar14[7] = in_XMM1_Bm;
          auVar14[8] = in_XMM1_Bn;
          auVar14[9] = in_XMM1_Bo;
          auVar14[10] = in_XMM1_Bp;
          uVar27 = (ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB141(auVar20 >> 7,0) & 1) << 2 |
                            (ushort)(SUB131(auVar18 >> 7,0) & 1) << 3 |
                            (ushort)(SUB121(auVar16 >> 7,0) & 1) << 4 |
                            (ushort)(SUB111(auVar14 >> 7,0) & 1) << 5 |
                            (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                     CONCAT18(in_XMM1_Bo,
                                                              CONCAT17(in_XMM1_Bn,
                                                                       CONCAT16(in_XMM1_Bm,
                                                                                CONCAT15(in_XMM1_Bl,
                                                                                         CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                            (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                     CONCAT17(in_XMM1_Bo,
                                                              CONCAT16(in_XMM1_Bn,
                                                                       CONCAT15(in_XMM1_Bm,
                                                                                CONCAT14(in_XMM1_Bl,
                                                                                         CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                           7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
          uVar5 = 0;
          if (uVar27 != 0) {
            for (; (uVar27 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
            }
          }
          psVar29 = (slot_type *)((long)psVar29 + (ulong)(uVar5 << 4));
          cVar1 = pcVar33[uVar5];
          pcVar33 = pcVar33 + uVar5;
        }
        pcVar23 = local_c0;
        pcVar24 = local_b0;
        pdVar25 = local_a8;
      } while (pcVar33 != pcVar3);
    }
    scope_guard::~scope_guard(&local_d8);
  }
  return;
}

Assistant:

void foreach_helper(const context_t &context, const string &iterator, const var &obj,
	                    std::deque<statement_base *> &body)
	{
		if (obj.const_val<T>().empty())
			return;
		if (context->instance->break_block)
			context->instance->break_block = false;
		if (context->instance->continue_block)
			context->instance->continue_block = false;
		scope_guard scope(context);
		for (const X &it: obj.const_val<T>()) {
			current_process->poll_event();
			context->instance->storage.add_var_no_return(iterator, it);
			for (auto &ptr: body) {
				try {
					ptr->run();
				}
				catch (const cs::exception &e) {
					throw e;
				}
				catch (const std::exception &e) {
					throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
				}
				if (context->instance->return_fcall) {
					return;
				}
				if (context->instance->break_block) {
					context->instance->break_block = false;
					return;
				}
				if (context->instance->continue_block) {
					context->instance->continue_block = false;
					break;
				}
			}
			scope.clear();
		}
	}